

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>,_kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1823:13),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>,_kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1823:13),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_> *pEVar1;
  Maybe<kj::Own<kj::AsyncCapabilityStream>_> *in_00;
  Promise<kj::Own<kj::AsyncCapabilityStream>_> local_608;
  ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_> local_5f8;
  Maybe<kj::Own<kj::AsyncCapabilityStream>_> *local_480;
  Maybe<kj::Own<kj::AsyncCapabilityStream>_> *depValue;
  ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_> local_320;
  Exception *local_1a8;
  Exception *depException;
  undefined1 local_190 [8];
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>,_kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1823:13),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr.field_1.value.ptr.ptr = (AsyncCapabilityStream *)output;
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>::ExceptionOr
            ((ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> *)local_190);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_190);
  local_1a8 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_190);
  if (local_1a8 == (Exception *)0x0) {
    local_480 = readMaybe<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>>
                          ((Maybe<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_480 != (Maybe<kj::Own<kj::AsyncCapabilityStream>_> *)0x0) {
      in_00 = mv<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>>(local_480);
      MaybeVoidCaller<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>,kj::Promise<kj::Own<kj::AsyncCapabilityStream>>>
      ::apply<kj::AsyncCapabilityStream::receiveStream()::__0>
                ((MaybeVoidCaller<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>,kj::Promise<kj::Own<kj::AsyncCapabilityStream>>>
                  *)&local_608,(Type *)&this->field_0x20,in_00);
      handle(&local_5f8,this,&local_608);
      pEVar1 = ExceptionOrValue::as<kj::Promise<kj::Own<kj::AsyncCapabilityStream>>>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.ptr.ptr);
      ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_>::operator=(pEVar1,&local_5f8);
      ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_>::~ExceptionOr(&local_5f8);
      Promise<kj::Own<kj::AsyncCapabilityStream>_>::~Promise(&local_608);
    }
  }
  else {
    in = mv<kj::Exception>(local_1a8);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x21,in)
    ;
    handle(&local_320,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::Promise<kj::Own<kj::AsyncCapabilityStream>>>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.ptr.ptr);
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_>::operator=(pEVar1,&local_320);
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_>::~ExceptionOr(&local_320);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>::~ExceptionOr
            ((ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> *)local_190);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }